

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

lc_funcdefs * funcdef_new(long addr,char *name)

{
  char *pcVar1;
  lc_funcdefs *f;
  char *name_local;
  long addr_local;
  
  addr_local = (long)malloc(0x30);
  memset((void *)addr_local,0,0x30);
  if ((undefined8 *)addr_local == (undefined8 *)0x0) {
    lc_error("Could not alloc function definition for \'%s\'.",name);
    addr_local = 0;
  }
  else {
    *(undefined8 *)addr_local = 0;
    *(long *)(addr_local + 0x10) = addr;
    pcVar1 = strdup(name);
    *(char **)(addr_local + 8) = pcVar1;
    *(undefined8 *)(addr_local + 0x28) = 0;
    *(undefined8 *)(addr_local + 0x18) = 0;
    *(undefined8 *)(addr_local + 0x20) = 0;
  }
  return (lc_funcdefs *)addr_local;
}

Assistant:

struct lc_funcdefs *funcdef_new(long addr, char *name)
{
	struct lc_funcdefs *f = New(struct lc_funcdefs);
	if (!f) {
	    lc_error("Could not alloc function definition for '%s'.", name);
	    return NULL;
	}
	f->next = NULL;
	f->addr = addr;
	f->name = strdup(name);
	f->n_called = 0;
	f->code.opcodes = NULL;
	f->code.n_opcodes = 0;
	return f;
}